

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

int run_run_container_andnot(run_container_t *src_1,run_container_t *src_2,container_t **dst)

{
  container_t *pcVar1;
  byte local_29;
  run_container_t *prStack_28;
  uint8_t typecode_after;
  run_container_t *ans;
  container_t **dst_local;
  run_container_t *src_2_local;
  run_container_t *src_1_local;
  
  ans = (run_container_t *)dst;
  dst_local = (container_t **)src_2;
  src_2_local = src_1;
  prStack_28 = run_container_create();
  run_container_andnot(src_2_local,(run_container_t *)dst_local,prStack_28);
  pcVar1 = convert_run_to_efficient_container_and_free(prStack_28,&local_29);
  *(container_t **)ans = pcVar1;
  return (int)local_29;
}

Assistant:

int run_run_container_andnot(
    const run_container_t *src_1, const run_container_t *src_2,
    container_t **dst
){
    run_container_t *ans = run_container_create();
    run_container_andnot(src_1, src_2, ans);
    uint8_t typecode_after;
    *dst = convert_run_to_efficient_container_and_free(ans, &typecode_after);
    return typecode_after;
}